

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  FieldDescriptorProto *field_00;
  bool bVar1;
  int path2;
  string *output;
  OneofOptions *options;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages;
  string_view local_148;
  FieldDescriptorProto *local_138;
  FieldDescriptorProto *field;
  LocationRecorder field_location;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  undefined1 local_d8 [8];
  LocationRecorder option_location;
  ErrorMaker local_b0;
  string_view local_a0;
  uint local_8c;
  ErrorMaker local_88 [2];
  undefined1 local_68 [8];
  LocationRecorder name_location;
  LocationRecorder *containing_type_location_local;
  LocationRecorder *oneof_location_local;
  int oneof_index_local;
  DescriptorProto *containing_type_local;
  OneofDescriptorProto *oneof_decl_local;
  Parser *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&name_location.location_,"oneof");
  bVar1 = Consume(this,stack0xffffffffffffffb0);
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_68,oneof_location,1);
    output = OneofDescriptorProto::mutable_name_abi_cxx11_(oneof_decl);
    ErrorMaker::ErrorMaker(local_88,"Expected oneof name.");
    bVar1 = ConsumeIdentifier(this,output,local_88[0]);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    local_8c = (uint)!bVar1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_68);
    if (local_8c == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"{");
      bVar1 = ConsumeEndOfDeclaration(this,local_a0,oneof_location);
      if (bVar1) {
        do {
          bVar1 = AtEnd(this);
          if (bVar1) {
            ErrorMaker::ErrorMaker
                      (&local_b0,"Reached end of input in oneof definition (missing \'}\').");
            RecordError(this,local_b0);
            this_local._7_1_ = 0;
            goto LAB_0059d9a6;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&option_location.location_,
                     "option");
          bVar1 = LookingAt(this,stack0xffffffffffffff40);
          if (bVar1) {
            LocationRecorder::LocationRecorder((LocationRecorder *)local_d8,oneof_location,2);
            options = OneofDescriptorProto::mutable_options(oneof_decl);
            bVar1 = ParseOption(this,&options->super_Message,(LocationRecorder *)local_d8,
                                containing_file,OPTION_STATEMENT);
            if (bVar1) {
              local_8c = 3;
            }
            else {
              this_local._7_1_ = 0;
              local_8c = 1;
            }
            LocationRecorder::~LocationRecorder((LocationRecorder *)local_d8);
            if (local_8c == 1) goto LAB_0059d9a6;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_e8,"required");
            bVar1 = LookingAt(this,local_e8);
            if (bVar1) {
LAB_0059d81a:
              ErrorMaker::ErrorMaker
                        ((ErrorMaker *)&field_location.location_,
                         "Fields in oneofs must not have labels (required / optional / repeated).");
              RecordError(this,stack0xfffffffffffffee8);
              io::Tokenizer::Next(this->input_);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_f8,"optional");
              bVar1 = LookingAt(this,local_f8);
              if (bVar1) goto LAB_0059d81a;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_108,"repeated");
              bVar1 = LookingAt(this,local_108);
              if (bVar1) goto LAB_0059d81a;
            }
            path2 = DescriptorProto::field_size(containing_type);
            LocationRecorder::LocationRecorder
                      ((LocationRecorder *)&field,containing_type_location,2,path2);
            local_138 = DescriptorProto::add_field(containing_type);
            FieldDescriptorProto::set_label(local_138,FieldDescriptorProto_Label_LABEL_OPTIONAL);
            FieldDescriptorProto::set_oneof_index(local_138,oneof_index);
            field_00 = local_138;
            messages = DescriptorProto::mutable_nested_type(containing_type);
            bVar1 = ParseMessageFieldNoLabel
                              (this,field_00,messages,containing_type_location,3,
                               (LocationRecorder *)&field,containing_file);
            if (!bVar1) {
              SkipStatement(this);
            }
            LocationRecorder::~LocationRecorder((LocationRecorder *)&field);
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"}");
          bVar1 = TryConsumeEndOfDeclaration(this,local_148,(LocationRecorder *)0x0);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0059d9a6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type, int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      RecordError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") || LookingAt("optional") ||
        LookingAt("repeated")) {
      RecordError(
          "Fields in oneofs must not have labels (required / optional "
          "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field, containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", nullptr));

  return true;
}